

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *__s;
  bool bVar1;
  int iVar2;
  ostream *this;
  char *local_90;
  char *v;
  int i;
  array local_78 [8];
  iterator local_70;
  buffer buf;
  undefined1 local_60 [72];
  char **local_18;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  local_18 = argv;
  argv_local._0_4_ = argc;
  mtrace();
  mpt::array::array(local_78,0);
  mpt::io::buffer::buffer((buffer *)&local_70,local_78);
  mpt::array::~array(local_78);
  for (v._0_4_ = 0; (int)v < (int)argv_local; v._0_4_ = (int)v + 1) {
    __s = local_18[(int)v];
    strlen(__s);
    mpt::io::buffer::write((ulong)&local_70,(void *)0x1,(ulong)__s);
  }
  local_90 = strrchr(*local_18,0x2f);
  if (local_90 != (char *)0x0) {
    mpt::encode_array::shift((ulong)local_60);
  }
  do {
    bVar1 = mpt::iterator::get<char_const*>(&local_70,&local_90);
    if (!bVar1) break;
    this = std::operator<<((ostream *)&std::cout,local_90);
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    iVar2 = mpt::io::buffer::advance();
  } while (0 < iVar2);
  argv_local._4_4_ = 0;
  mpt::io::buffer::~buffer((buffer *)&local_70);
  return argv_local._4_4_;
}

Assistant:

extern int main(int argc, char * const argv[])
{
	mtrace();
	
	mpt::io::buffer buf;
	
	// write arguments (null-terminated) to buffer
	for (int i = 0; i < argc; ++i) {
		buf.write(1, argv[i], strlen(argv[i]) + 1);
	}
	// consume first argument up to path separator
	const char *v;
	if ((v = std::strrchr(*argv, '/'))) {
		buf.shift(v + 1 - *argv);
	}
	// print arguments in buffer
	while (buf.iterator::get(v)) {
		std::cout << v << std::endl;
		if (buf.advance() <= 0) {
			break;
		}
	}
	return 0;
}